

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_small_width_height_test.cc
# Opt level: O2

void anon_unknown.dwarf_103885e::Encode1x1(aom_img_fmt fmt,int bitdepth,aom_codec_flags_t flags)

{
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> _Var1;
  aom_codec_iface_t *iface;
  pointer *__ptr;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  SEARCH_METHODS *pSVar2;
  ulong __n;
  AssertHelper local_4c8;
  AssertHelper local_4c0;
  AssertionResult gtest_ar_4;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> v_plane;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> u_plane;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> y_plane;
  aom_codec_ctx_t enc;
  aom_image_t img;
  aom_codec_enc_cfg_t cfg;
  
  memset(&img,0,0xa8);
  img.w = 1;
  img.h = 1;
  img.d_w = 1;
  img.d_h = 1;
  img.x_chroma_shift = 1;
  img.y_chroma_shift = 1;
  img.bps = 0xc;
  __n = (ulong)(8 < bitdepth) + 1;
  img.stride[0] = 1;
  img.stride[1] = 1;
  img.stride[2] = 1;
  img.fmt = fmt;
  img.bit_depth = bitdepth;
  _Var1.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)operator_new__(__n);
  memset((void *)_Var1.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                 _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                 .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,__n);
  enc.name = (char *)0x0;
  y_plane._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       _Var1.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  testing::internal::
  CmpHelperNE<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,decltype(nullptr)>
            ((internal *)&cfg,"y_plane","nullptr",&y_plane,&enc.name);
  if ((char)cfg.g_usage == '\0') {
    testing::Message::Message((Message *)&enc);
    if ((undefined8 *)CONCAT44(cfg.g_w,cfg.g_profile) == (undefined8 *)0x0) {
      pSVar2 = "";
    }
    else {
      pSVar2 = *(SEARCH_METHODS **)CONCAT44(cfg.g_w,cfg.g_profile);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_small_width_height_test.cc"
               ,0xd6,(char *)pSVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&enc);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    if (enc.name != (char *)0x0) {
      (**(code **)(*(long *)enc.name + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&cfg.g_profile);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&cfg.g_profile);
    _Var1.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)operator_new__(__n);
    memset((void *)_Var1.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,__n);
    enc.name = (char *)0x0;
    u_plane._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         _Var1.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    testing::internal::
    CmpHelperNE<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,decltype(nullptr)>
              ((internal *)&cfg,"u_plane","nullptr",&u_plane,&enc.name);
    if ((char)cfg.g_usage == '\0') {
      testing::Message::Message((Message *)&enc);
      if ((undefined8 *)CONCAT44(cfg.g_w,cfg.g_profile) == (undefined8 *)0x0) {
        pSVar2 = "";
      }
      else {
        pSVar2 = *(SEARCH_METHODS **)CONCAT44(cfg.g_w,cfg.g_profile);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_small_width_height_test.cc"
                 ,0xd9,(char *)pSVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&enc);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
      if (enc.name != (char *)0x0) {
        (**(code **)(*(long *)enc.name + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&cfg.g_profile);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&cfg.g_profile);
      _Var1.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
           operator_new__(__n);
      memset((void *)_Var1.
                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,__n);
      enc.name = (char *)0x0;
      v_plane._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
           _Var1.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      testing::internal::
      CmpHelperNE<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,decltype(nullptr)>
                ((internal *)&cfg,"v_plane","nullptr",&v_plane,&enc.name);
      if ((char)cfg.g_usage == '\0') {
        testing::Message::Message((Message *)&enc);
        if ((undefined8 *)CONCAT44(cfg.g_w,cfg.g_profile) == (undefined8 *)0x0) {
          pSVar2 = "";
        }
        else {
          pSVar2 = *(SEARCH_METHODS **)CONCAT44(cfg.g_w,cfg.g_profile);
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_4,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_small_width_height_test.cc"
                   ,0xdc,(char *)pSVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&enc);
        this = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&cfg.g_profile;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
        if (enc.name != (char *)0x0) {
          (**(code **)(*(long *)enc.name + 8))();
        }
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&cfg.g_profile);
        img.planes[0] =
             (uchar *)y_plane._M_t.
                      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                      .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
        img.planes[1] =
             (uchar *)u_plane._M_t.
                      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                      .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
        img.planes[2] =
             (uchar *)v_plane._M_t.
                      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                      .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
        iface = aom_codec_av1_cx();
        gtest_ar_4.success_ = false;
        gtest_ar_4._1_3_ = 0;
        local_4c8.data_._0_4_ = aom_codec_enc_config_default(iface,&cfg,0);
        testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                  ((internal *)&enc,"AOM_CODEC_OK",
                   "aom_codec_enc_config_default(iface, &cfg, kUsage)",
                   (aom_codec_err_t *)&gtest_ar_4,(aom_codec_err_t *)&local_4c8);
        if ((char)enc.name == '\0') {
          testing::Message::Message((Message *)&gtest_ar_4);
          if (enc.iface == (aom_codec_iface_t *)0x0) {
            pSVar2 = "";
          }
          else {
            pSVar2 = (SEARCH_METHODS *)(enc.iface)->name;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_4c8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_small_width_height_test.cc"
                     ,0xe3,(char *)pSVar2);
          testing::internal::AssertHelper::operator=(&local_4c8,(Message *)&gtest_ar_4);
          testing::internal::AssertHelper::~AssertHelper(&local_4c8);
          if ((long *)CONCAT44(gtest_ar_4._4_4_,gtest_ar_4._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(gtest_ar_4._4_4_,gtest_ar_4._0_4_) + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&enc.iface);
        cfg.g_w = 1;
        cfg.g_h = 1;
        local_4c8.data_._0_4_ = 0;
        local_4c0.data_._0_4_ = aom_codec_enc_init_ver(&enc,iface,&cfg,flags,0x1d);
        testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                  ((internal *)&gtest_ar_4,"AOM_CODEC_OK",
                   "aom_codec_enc_init_ver(&enc, iface, &cfg, flags, (10 + (7 + (9)) + 3))",
                   (aom_codec_err_t *)&local_4c8,(aom_codec_err_t *)&local_4c0);
        if (gtest_ar_4.success_ == false) {
          testing::Message::Message((Message *)&local_4c8);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_4.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pSVar2 = "";
          }
          else {
            pSVar2 = *(SEARCH_METHODS **)
                      gtest_ar_4.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_4c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_small_width_height_test.cc"
                     ,0xe7,(char *)pSVar2);
          testing::internal::AssertHelper::operator=(&local_4c0,(Message *)&local_4c8);
          testing::internal::AssertHelper::~AssertHelper(&local_4c0);
          if ((long *)CONCAT44(local_4c8.data_._4_4_,(aom_codec_err_t)local_4c8.data_) !=
              (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_4c8.data_._4_4_,(aom_codec_err_t)local_4c8.data_) +
                        8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_4.message_);
        local_4c8.data_._0_4_ = 0;
        local_4c0.data_._0_4_ = aom_codec_control(&enc,0xd,5);
        testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                  ((internal *)&gtest_ar_4,"AOM_CODEC_OK",
                   "aom_codec_control(&enc, AOME_SET_CPUUSED, 5)",(aom_codec_err_t *)&local_4c8,
                   (aom_codec_err_t *)&local_4c0);
        if (gtest_ar_4.success_ == false) {
          testing::Message::Message((Message *)&local_4c8);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_4.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pSVar2 = "";
          }
          else {
            pSVar2 = *(SEARCH_METHODS **)
                      gtest_ar_4.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_4c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_small_width_height_test.cc"
                     ,0xe8,(char *)pSVar2);
          testing::internal::AssertHelper::operator=(&local_4c0,(Message *)&local_4c8);
          testing::internal::AssertHelper::~AssertHelper(&local_4c0);
          if ((long *)CONCAT44(local_4c8.data_._4_4_,(aom_codec_err_t)local_4c8.data_) !=
              (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_4c8.data_._4_4_,(aom_codec_err_t)local_4c8.data_) +
                        8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_4.message_);
        local_4c8.data_._0_4_ = 0;
        local_4c0.data_._0_4_ = aom_codec_encode(&enc,&img,0,1,0);
        testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                  ((internal *)&gtest_ar_4,"AOM_CODEC_OK","aom_codec_encode(&enc, &img, 0, 1, 0)",
                   (aom_codec_err_t *)&local_4c8,(aom_codec_err_t *)&local_4c0);
        if (gtest_ar_4.success_ == false) {
          testing::Message::Message((Message *)&local_4c8);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_4.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pSVar2 = "";
          }
          else {
            pSVar2 = *(SEARCH_METHODS **)
                      gtest_ar_4.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_4c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_small_width_height_test.cc"
                     ,0xe9,(char *)pSVar2);
          testing::internal::AssertHelper::operator=(&local_4c0,(Message *)&local_4c8);
          testing::internal::AssertHelper::~AssertHelper(&local_4c0);
          if ((long *)CONCAT44(local_4c8.data_._4_4_,(aom_codec_err_t)local_4c8.data_) !=
              (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_4c8.data_._4_4_,(aom_codec_err_t)local_4c8.data_) +
                        8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_4.message_);
        local_4c8.data_._0_4_ = 0;
        local_4c0.data_._0_4_ = aom_codec_encode(&enc,(aom_image_t *)0x0,0,0,0);
        testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                  ((internal *)&gtest_ar_4,"AOM_CODEC_OK","aom_codec_encode(&enc, nullptr, 0, 0, 0)"
                   ,(aom_codec_err_t *)&local_4c8,(aom_codec_err_t *)&local_4c0);
        if (gtest_ar_4.success_ == false) {
          testing::Message::Message((Message *)&local_4c8);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_4.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pSVar2 = "";
          }
          else {
            pSVar2 = *(SEARCH_METHODS **)
                      gtest_ar_4.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_4c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_small_width_height_test.cc"
                     ,0xea,(char *)pSVar2);
          testing::internal::AssertHelper::operator=(&local_4c0,(Message *)&local_4c8);
          testing::internal::AssertHelper::~AssertHelper(&local_4c0);
          if ((long *)CONCAT44(local_4c8.data_._4_4_,(aom_codec_err_t)local_4c8.data_) !=
              (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_4c8.data_._4_4_,(aom_codec_err_t)local_4c8.data_) +
                        8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_4.message_);
        local_4c8.data_._0_4_ = 0;
        local_4c0.data_._0_4_ = aom_codec_destroy(&enc);
        testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                  ((internal *)&gtest_ar_4,"AOM_CODEC_OK","aom_codec_destroy(&enc)",
                   (aom_codec_err_t *)&local_4c8,(aom_codec_err_t *)&local_4c0);
        if (gtest_ar_4.success_ == false) {
          testing::Message::Message((Message *)&local_4c8);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_4.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pSVar2 = "";
          }
          else {
            pSVar2 = *(SEARCH_METHODS **)
                      gtest_ar_4.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_4c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_small_width_height_test.cc"
                     ,0xeb,(char *)pSVar2);
          testing::internal::AssertHelper::operator=(&local_4c0,(Message *)&local_4c8);
          testing::internal::AssertHelper::~AssertHelper(&local_4c0);
          if ((long *)CONCAT44(local_4c8.data_._4_4_,(aom_codec_err_t)local_4c8.data_) !=
              (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_4c8.data_._4_4_,(aom_codec_err_t)local_4c8.data_) +
                        8))();
          }
        }
        this = &gtest_ar_4.message_;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(this);
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&v_plane)
      ;
    }
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&u_plane);
  }
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&y_plane);
  return;
}

Assistant:

void Encode1x1(aom_img_fmt fmt, int bitdepth, aom_codec_flags_t flags) {
  constexpr int kWidth = 1;
  constexpr int kHeight = 1;

  // This test cannot use aom_img_alloc() or aom_img_wrap() because they call
  // align_image_dimension() to align img.w and img.h to the next even number
  // (2). In this test it is important to set img.w and img.h to 1. Therefore we
  // set up img manually.
  aom_image_t img;
  memset(&img, 0, sizeof(img));
  img.fmt = fmt;
  img.bit_depth = bitdepth;
  img.w = kWidth;
  img.h = kHeight;
  img.d_w = kWidth;
  img.d_h = kHeight;
  img.x_chroma_shift = 1;
  img.y_chroma_shift = 1;
  img.bps = 12;
  const int y_stride = kWidth;
  const int uv_stride = (kWidth + 1) >> 1;
  int y_height = kHeight;
  int uv_height = (kHeight + 1) >> 1;
  if (bitdepth > 8) {
    y_height <<= 1;
    uv_height <<= 1;
  }
  img.stride[AOM_PLANE_Y] = y_stride;
  img.stride[AOM_PLANE_U] = img.stride[AOM_PLANE_V] = uv_stride;
  std::unique_ptr<unsigned char[]> y_plane(
      new unsigned char[y_height * y_stride]());
  ASSERT_NE(y_plane, nullptr);
  std::unique_ptr<unsigned char[]> u_plane(
      new unsigned char[uv_height * uv_stride]());
  ASSERT_NE(u_plane, nullptr);
  std::unique_ptr<unsigned char[]> v_plane(
      new unsigned char[uv_height * uv_stride]());
  ASSERT_NE(v_plane, nullptr);
  img.planes[AOM_PLANE_Y] = y_plane.get();
  img.planes[AOM_PLANE_U] = u_plane.get();
  img.planes[AOM_PLANE_V] = v_plane.get();

  aom_codec_iface_t *iface = aom_codec_av1_cx();
  aom_codec_enc_cfg_t cfg;
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_enc_config_default(iface, &cfg, kUsage));
  cfg.g_w = kWidth;
  cfg.g_h = kHeight;
  aom_codec_ctx_t enc;
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_enc_init(&enc, iface, &cfg, flags));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_control(&enc, AOME_SET_CPUUSED, 5));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_encode(&enc, &img, 0, 1, 0));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_encode(&enc, nullptr, 0, 0, 0));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_destroy(&enc));
}